

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O1

void __thiscall
VectorFormatter<DifferenceFormatter>::
Ser<DataStream,std::vector<unsigned_short,std::allocator<unsigned_short>>>
          (VectorFormatter<DifferenceFormatter> *this,DataStream *s,
          vector<unsigned_short,_std::allocator<unsigned_short>_> *v)

{
  unsigned_short *puVar1;
  value_type_conflict4 *elem;
  unsigned_short *puVar2;
  long in_FS_OFFSET;
  DifferenceFormatter formatter;
  DifferenceFormatter local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_30.m_shift = 0;
  WriteCompactSize<DataStream>
            (s,(long)(v->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(v->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
                     _M_impl.super__Vector_impl_data._M_start >> 1);
  puVar2 = (v->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar1 = (v->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar2 != puVar1) {
    do {
      DifferenceFormatter::Ser<DataStream,unsigned_short>(&local_30,s,*puVar2);
      puVar2 = puVar2 + 1;
    } while (puVar2 != puVar1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Ser(Stream& s, const V& v)
    {
        Formatter formatter;
        WriteCompactSize(s, v.size());
        for (const typename V::value_type& elem : v) {
            formatter.Ser(s, elem);
        }
    }